

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

boolean jpeg_finish_decompress(j_decompress_ptr cinfo)

{
  int iVar1;
  j_common_ptr in_RDI;
  
  if (((in_RDI->global_state == 0xcd) || (in_RDI->global_state == 0xce)) &&
     (*(int *)&in_RDI[2].mem == 0)) {
    if (*(uint *)&in_RDI[4].mem < *(uint *)((long)&in_RDI[3].progress + 4)) {
      in_RDI->err->msg_code = 0x43;
      (*in_RDI->err->error_exit)(in_RDI);
    }
    (**(code **)((long)in_RDI[0xd].client_data + 8))(in_RDI);
    in_RDI->global_state = 0xd2;
  }
  else if (in_RDI->global_state == 0xcf) {
    in_RDI->global_state = 0xd2;
  }
  else if (in_RDI->global_state != 0xd2) {
    in_RDI->err->msg_code = 0x14;
    (in_RDI->err->msg_parm).i[0] = in_RDI->global_state;
    (*in_RDI->err->error_exit)(in_RDI);
  }
  do {
    if (*(int *)((long)&in_RDI[0xe].progress[1].progress_monitor + 4) != 0) {
      (**(code **)((long)&(in_RDI[1].err)->msg_parm + 4))(in_RDI);
      jpeg_abort(in_RDI);
      return 1;
    }
    iVar1 = (*(in_RDI[0xe].progress)->progress_monitor)(in_RDI);
  } while (iVar1 != 0);
  return 0;
}

Assistant:

GLOBAL(boolean)
jpeg_finish_decompress(j_decompress_ptr cinfo)
{
  if ((cinfo->global_state == DSTATE_SCANNING ||
       cinfo->global_state == DSTATE_RAW_OK) && !cinfo->buffered_image) {
    /* Terminate final pass of non-buffered mode */
    if (cinfo->output_scanline < cinfo->output_height)
      ERREXIT(cinfo, JERR_TOO_LITTLE_DATA);
    (*cinfo->master->finish_output_pass) (cinfo);
    cinfo->global_state = DSTATE_STOPPING;
  } else if (cinfo->global_state == DSTATE_BUFIMAGE) {
    /* Finishing after a buffered-image operation */
    cinfo->global_state = DSTATE_STOPPING;
  } else if (cinfo->global_state != DSTATE_STOPPING) {
    /* STOPPING = repeat call after a suspension, anything else is error */
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  /* Read until EOI */
  while (!cinfo->inputctl->eoi_reached) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return FALSE;             /* Suspend, come back later */
  }
  /* Do final cleanup */
  (*cinfo->src->term_source) (cinfo);
  /* We can use jpeg_abort to release memory and reset global_state */
  jpeg_abort((j_common_ptr)cinfo);
  return TRUE;
}